

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

void duckdb_je_background_thread_prefork0(tsdn_t *tsdn)

{
  duckdb_je_malloc_mutex_prefork(tsdn,&duckdb_je_background_thread_lock);
  background_thread_enabled_at_fork = (_Bool)(duckdb_je_background_thread_enabled_state.repr & 1);
  return;
}

Assistant:

void
background_thread_prefork0(tsdn_t *tsdn) {
	malloc_mutex_prefork(tsdn, &background_thread_lock);
	background_thread_enabled_at_fork = background_thread_enabled();
}